

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIDFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall
CIDFontWriter::WriteFont
          (CIDFontWriter *this,FreeTypeFaceWrapper *inFontInfo,
          WrittenFontRepresentation *inFontOccurrence,ObjectsContext *inObjectsContext,
          IDescendentFontWriter *inDescendentFontWriter,bool inEmbedFont)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  long lVar3;
  IndirectObjectsReferenceRegistry *pIVar4;
  ObjectIDType indirectObjectID;
  size_type sVar5;
  ObjectIDType inObjectReference;
  ObjectIDType toUnicodeMapObjectID;
  ObjectIDType descendantFontID;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string fontName;
  undefined1 local_60 [8];
  string postscriptFontName;
  DictionaryContext *fontContext;
  EStatusCode status;
  bool inEmbedFont_local;
  IDescendentFontWriter *inDescendentFontWriter_local;
  ObjectsContext *inObjectsContext_local;
  WrittenFontRepresentation *inFontOccurrence_local;
  FreeTypeFaceWrapper *inFontInfo_local;
  CIDFontWriter *this_local;
  
  EVar1 = ObjectsContext::StartNewIndirectObject
                    (inObjectsContext,inFontOccurrence->mWrittenObjectID);
  if (EVar1 != eSuccess) {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,
                      "CIDFontWriter::WriteFont, unexpected failure. could not write font object %ld"
                      ,inFontOccurrence->mWrittenObjectID);
    return EVar1;
  }
  this->mFontInfo = inFontInfo;
  this->mFontOccurrence = inFontOccurrence;
  this->mObjectsContext = inObjectsContext;
  postscriptFontName.field_2._8_8_ = ObjectsContext::StartDictionary(inObjectsContext);
  DictionaryContext::WriteKey
            ((DictionaryContext *)postscriptFontName.field_2._8_8_,&scType_abi_cxx11_);
  DictionaryContext::WriteNameValue
            ((DictionaryContext *)postscriptFontName.field_2._8_8_,&scFont_abi_cxx11_);
  DictionaryContext::WriteKey
            ((DictionaryContext *)postscriptFontName.field_2._8_8_,&scSubtype_abi_cxx11_);
  DictionaryContext::WriteNameValue
            ((DictionaryContext *)postscriptFontName.field_2._8_8_,&scType0_abi_cxx11_);
  DictionaryContext::WriteKey
            ((DictionaryContext *)postscriptFontName.field_2._8_8_,&scBaseFont_abi_cxx11_);
  FreeTypeFaceWrapper::GetPostscriptName_abi_cxx11_((string *)local_60,inFontInfo);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 0) {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,
                      "CIDFontWriter::WriteFont, unexpected failure. no postscript font name for font"
                     );
    fontContext._0_4_ = eFailure;
    fontName.field_2._8_4_ = 2;
    goto LAB_002b27ca;
  }
  if (inEmbedFont) {
    ObjectsContext::GenerateSubsetFontPrefix_abi_cxx11_(&local_d0,inObjectsContext);
    std::operator+(&local_b0,&local_d0,&scPlus_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   &local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    std::__cxx11::string::string((string *)local_90,(string *)local_60);
  }
  DictionaryContext::WriteNameValue
            ((DictionaryContext *)postscriptFontName.field_2._8_8_,(string *)local_90);
  WriteEncoding(this,(DictionaryContext *)postscriptFontName.field_2._8_8_);
  pIVar4 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  indirectObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar4);
  DictionaryContext::WriteKey
            ((DictionaryContext *)postscriptFontName.field_2._8_8_,&scDescendantFonts_abi_cxx11_);
  ObjectsContext::StartArray(this->mObjectsContext);
  ObjectsContext::WriteNewIndirectObjectReference
            (this->mObjectsContext,indirectObjectID,eTokenSeparatorSpace);
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  CalculateCharacterEncodingArray(this);
  sVar5 = std::
          vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
          ::size(&this->mCharactersVector);
  if (sVar5 < 2) {
    fontContext._0_4_ =
         ObjectsContext::EndDictionary
                   (inObjectsContext,(DictionaryContext *)postscriptFontName.field_2._8_8_);
    if ((EStatusCode)fontContext == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
LAB_002b2766:
      fontContext._0_4_ =
           (*inDescendentFontWriter->_vptr_IDescendentFontWriter[2])
                     (inDescendentFontWriter,indirectObjectID,local_90,this->mFontInfo,
                      &this->mCharactersVector,this->mObjectsContext,inEmbedFont & 1);
      fontName.field_2._8_4_ = 0;
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
      fontName.field_2._8_4_ = 2;
    }
  }
  else {
    DictionaryContext::WriteKey
              ((DictionaryContext *)postscriptFontName.field_2._8_8_,&scToUnicode_abi_cxx11_);
    pIVar4 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar4);
    DictionaryContext::WriteNewObjectReferenceValue
              ((DictionaryContext *)postscriptFontName.field_2._8_8_,inObjectReference);
    fontContext._0_4_ =
         ObjectsContext::EndDictionary
                   (inObjectsContext,(DictionaryContext *)postscriptFontName.field_2._8_8_);
    if ((EStatusCode)fontContext == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
      fontContext._0_4_ = WriteToUnicodeMap(this,inObjectReference);
      if ((EStatusCode)fontContext == eSuccess) goto LAB_002b2766;
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,"CIDFontWriter::WriteFont, failed to write unicode map %ld",
                        inObjectReference);
      fontName.field_2._8_4_ = 2;
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
      fontName.field_2._8_4_ = 2;
    }
  }
  std::__cxx11::string::~string((string *)local_90);
LAB_002b27ca:
  std::__cxx11::string::~string((string *)local_60);
  return (EStatusCode)fontContext;
}

Assistant:

EStatusCode CIDFontWriter::WriteFont(FreeTypeFaceWrapper& inFontInfo,
										WrittenFontRepresentation* inFontOccurrence,
										ObjectsContext* inObjectsContext,
										IDescendentFontWriter* inDescendentFontWriter,
										bool inEmbedFont)
{

	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		status = inObjectsContext->StartNewIndirectObject(inFontOccurrence->mWrittenObjectID);
		if(status != eSuccess)
		{
			TRACE_LOG1("CIDFontWriter::WriteFont, unexpected failure. could not write font object %ld",inFontOccurrence->mWrittenObjectID);
			break;
		}

		mFontInfo = &inFontInfo;
		mFontOccurrence = inFontOccurrence;
		mObjectsContext = inObjectsContext;
		DictionaryContext* fontContext = inObjectsContext->StartDictionary();

		// Type
		fontContext->WriteKey(scType);
		fontContext->WriteNameValue(scFont);

		// SubType
		fontContext->WriteKey(scSubtype);
		fontContext->WriteNameValue(scType0);

		// BaseFont
		fontContext->WriteKey(scBaseFont);
		std::string postscriptFontName = inFontInfo.GetPostscriptName();
		if(postscriptFontName.length() == 0)
		{
			TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. no postscript font name for font");
			status = PDFHummus::eFailure;
			break;
		}
		std::string fontName = inEmbedFont ? (inObjectsContext->GenerateSubsetFontPrefix() + scPlus + postscriptFontName) : postscriptFontName;
		fontContext->WriteNameValue(fontName);

		WriteEncoding(fontContext);

		// DescendantFonts 
		ObjectIDType descendantFontID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

		fontContext->WriteKey(scDescendantFonts);
		mObjectsContext->StartArray();
		mObjectsContext->WriteNewIndirectObjectReference(descendantFontID);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);

		CalculateCharacterEncodingArray(); // put the charachter in the order of encoding, for the ToUnicode map

		// ToUnicode
		if (mCharactersVector.size() > 1) {
			// make sure there's more than just the 0 char (which would make this an array of size of one
			fontContext->WriteKey(scToUnicode);
			ObjectIDType toUnicodeMapObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
			fontContext->WriteNewObjectReferenceValue(toUnicodeMapObjectID);

			status = inObjectsContext->EndDictionary(fontContext);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
				break;
			}
			inObjectsContext->EndIndirectObject();
			status = WriteToUnicodeMap(toUnicodeMapObjectID);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG1("CIDFontWriter::WriteFont, failed to write unicode map %ld", toUnicodeMapObjectID);
				break;
			}			
		}
		else {
			// else just finish font writing (a bit of an edge case here...but should take care of, for cleanliness)
			status = inObjectsContext->EndDictionary(fontContext);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
				break;
			}
			inObjectsContext->EndIndirectObject();
		}

		// Write the descendant font
		status = inDescendentFontWriter->WriteFont(descendantFontID, fontName, *mFontInfo, mCharactersVector, mObjectsContext, inEmbedFont);

	} while(false);

	return status;
}